

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O2

void __thiscall FloatInterval_Sqr_Test::~FloatInterval_Sqr_Test(FloatInterval_Sqr_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FloatInterval, Sqr) {
    FloatInterval a = FloatInterval(1.75, 2.25);
    FloatInterval as = Sqr(a), at = a * a;
    EXPECT_EQ(as.UpperBound(), at.UpperBound());
    EXPECT_EQ(as.LowerBound(), at.LowerBound());

    // Straddle 0
    FloatInterval b = FloatInterval(-.75, 1.25);
    FloatInterval bs = Sqr(b), b2 = b * b;
    EXPECT_EQ(bs.UpperBound(), b2.UpperBound());
    EXPECT_EQ(0, bs.LowerBound());
    EXPECT_LT(b2.LowerBound(), 0);
}